

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constants.cpp
# Opt level: O2

vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
* __thiscall
spvtools::opt::analysis::ConstantManager::GetConstantsFromIds
          (vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
           *__return_storage_ptr__,ConstantManager *this,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *ids)

{
  uint32_t *puVar1;
  uint32_t *puVar2;
  vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
  constants;
  Constant *c;
  _Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
  local_58;
  Constant *local_38;
  
  local_58._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  puVar2 = (ids->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar1 = (ids->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  do {
    if (puVar2 == puVar1) {
      (__return_storage_ptr__->
      super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
      )._M_impl.super__Vector_impl_data._M_start = local_58._M_impl.super__Vector_impl_data._M_start
      ;
      (__return_storage_ptr__->
      super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
      )._M_impl.super__Vector_impl_data._M_finish =
           local_58._M_impl.super__Vector_impl_data._M_finish;
      (__return_storage_ptr__->
      super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
      )._M_impl.super__Vector_impl_data._M_end_of_storage =
           local_58._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_58._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_58._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_58._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
LAB_004c8bad:
      std::
      _Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
      ::~_Vector_base(&local_58);
      return __return_storage_ptr__;
    }
    local_38 = FindDeclaredConstant(this,*puVar2);
    if (local_38 == (Constant *)0x0) {
      (__return_storage_ptr__->
      super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
      )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->
      super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
      )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->
      super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
      )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      goto LAB_004c8bad;
    }
    std::
    vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
    ::push_back((vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                 *)&local_58,&local_38);
    puVar2 = puVar2 + 1;
  } while( true );
}

Assistant:

std::vector<const Constant*> ConstantManager::GetConstantsFromIds(
    const std::vector<uint32_t>& ids) const {
  std::vector<const Constant*> constants;
  for (uint32_t id : ids) {
    if (const Constant* c = FindDeclaredConstant(id)) {
      constants.push_back(c);
    } else {
      return {};
    }
  }
  return constants;
}